

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O1

void lsvm::hashmap::copy_into_new_bucket
               (hashmap *h,hashbucket **pb,hashbucket **b,uint32_t new_size_indx)

{
  uint uVar1;
  int iVar2;
  hashbucket *ptr;
  hashbucket *phVar3;
  
  ptr = *b;
  *b = ptr->next;
  uVar1 = (&primes)[(byte)new_size_indx];
  phVar3 = (hashbucket *)memory::allocate((ulong)uVar1 * 0x18 + 0x10);
  phVar3->next = (hashbucket_t *)0x0;
  phVar3->count = 0;
  phVar3->bucket_size_indx = new_size_indx & 0xff;
  memset(phVar3 + 1,0,(ulong)uVar1 * 0x18);
  phVar3->next = *pb;
  *pb = phVar3;
  h->count = h->count - ptr->count;
  balance_partition(pb);
  iVar2 = (&primes)[ptr->bucket_size_indx];
  phVar3 = ptr + 1;
  do {
    if (*(void **)&phVar3->count != (void *)0x0) {
      insert_into_partition
                (h,(hash)phVar3->next,h->bits & (ushort)phVar3->next,*(void **)&phVar3->count,
                 phVar3[1].next,true);
    }
    phVar3 = (hashbucket *)&phVar3[1].count;
  } while (phVar3 <= (undefined1 *)((long)ptr + (ulong)(iVar2 - 1) * 0x18 + 0x10));
  memory::retain(ptr);
  balance_partition(pb);
  return;
}

Assistant:

inline void copy_into_new_bucket(hashmap* h, hashbucket** pb, hashbucket** b, uint32_t new_size_indx){

    // remove current bucket from partition and add new bigger one
    hashbucket* ob = *b;
    *b = (*b)->next;
    add_new_bucket(h,pb,new_size_indx);
    h->count -= ob->count;
    
    // rebalance partition
    balance_partition(pb);

    // insert left-over keys into partition
    entry* he = entries(ob); 
    entry* ehe = get_entry(ob,bucket_size(ob)-1); 
    while(he <= ehe){
        if(he->key != null){
            insert_into_partition(h,he->keyhash,hashbit(he->keyhash,h->bits),he->key,he->val,true);
        }
        ++he;
    }
    
    // remove old bucket
    lsvm::memory::retain(ob);

    // rebalance partition
    balance_partition(pb);
}